

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

monst * restore_mon(memfile *mf)

{
  int8_t iVar1;
  uchar uVar2;
  byte bVar3;
  int16_t iVar4;
  int16_t iVar5;
  unsigned_short uVar6;
  int32_t iVar7;
  uint uVar8;
  uint uVar9;
  monst *pmVar10;
  coord *local_58;
  coord *local_50;
  eshk *shk;
  uint mflags;
  int billid;
  int i;
  int idx;
  short xtyp;
  short namelen;
  monst *mon;
  memfile *mf_local;
  
  mfmagic_check(mf,0x4e4f4d);
  iVar4 = mread16(mf);
  iVar5 = mread16(mf);
  pmVar10 = newmonst((int)iVar5,(int)iVar4);
  iVar7 = mread32(mf);
  if (iVar7 == -5000) {
    pmVar10->data = (permonst *)0x0;
  }
  else if (iVar7 == -4000) {
    pmVar10->data = &upermonst;
  }
  else if (iVar7 == -3000) {
    pmVar10->data = &pm_nemesis;
  }
  else if (iVar7 == -2000) {
    pmVar10->data = &pm_guardian;
  }
  else if (iVar7 == -1000) {
    pmVar10->data = &pm_leader;
  }
  else {
    if ((iVar7 < 0) || (0x192 < iVar7)) {
      panic("Restoring bad monster data.");
    }
    pmVar10->data = mons + iVar7;
  }
  uVar8 = mread32(mf);
  pmVar10->m_id = uVar8;
  iVar7 = mread32(mf);
  pmVar10->mhp = iVar7;
  iVar7 = mread32(mf);
  pmVar10->mhpmax = iVar7;
  iVar7 = mread32(mf);
  pmVar10->mspec_used = iVar7;
  uVar8 = mread32(mf);
  pmVar10->mtrapseen = uVar8;
  uVar8 = mread32(mf);
  pmVar10->mlstmv = uVar8;
  iVar7 = mread32(mf);
  pmVar10->mstrategy = iVar7;
  iVar7 = mread32(mf);
  pmVar10->meating = iVar7;
  mread(mf,pmVar10->mtrack,8);
  iVar4 = mread16(mf);
  pmVar10->mnum = iVar4;
  iVar1 = mread8(mf);
  pmVar10->mx = iVar1;
  iVar1 = mread8(mf);
  pmVar10->my = iVar1;
  iVar1 = mread8(mf);
  pmVar10->mux = iVar1;
  iVar1 = mread8(mf);
  pmVar10->muy = iVar1;
  uVar2 = mread8(mf);
  pmVar10->m_lev = uVar2;
  iVar1 = mread8(mf);
  pmVar10->malign = iVar1;
  iVar4 = mread16(mf);
  pmVar10->movement = iVar4;
  uVar6 = mread16(mf);
  pmVar10->mintrinsics = uVar6;
  iVar1 = mread8(mf);
  pmVar10->mtame = iVar1;
  uVar2 = mread8(mf);
  pmVar10->m_ap_type = uVar2;
  uVar2 = mread8(mf);
  pmVar10->mfrozen = uVar2;
  uVar2 = mread8(mf);
  pmVar10->mblinded = uVar2;
  uVar8 = mread32(mf);
  pmVar10->mappearance = uVar8;
  uVar8 = mread32(mf);
  uVar2 = mread8(mf);
  pmVar10->mfleetim = uVar2;
  iVar1 = mread8(mf);
  pmVar10->weapon_check = iVar1;
  iVar7 = mread32(mf);
  pmVar10->misc_worn_check = iVar7;
  uVar2 = mread8(mf);
  pmVar10->wormno = uVar2;
  iVar1 = mread8(mf);
  pmVar10->minvent = (obj *)(ulong)(iVar1 != '\0');
  iVar1 = mread8(mf);
  pmVar10->mw = (obj *)(ulong)(iVar1 != '\0');
  if (pmVar10->mnamelth != '\0') {
    mread(mf,(void *)((long)(pmVar10->mtrack + 0x18) + (long)(int)pmVar10->mxlth),
          (uint)pmVar10->mnamelth);
  }
  switch(pmVar10->mxtyp) {
  case '\x01':
    iVar1 = mread8(mf);
    pmVar10->field_0x74 = iVar1;
    iVar1 = mread8(mf);
    pmVar10->field_0x75 = iVar1;
    iVar1 = mread8(mf);
    pmVar10->field_0x76 = iVar1;
    iVar1 = mread8(mf);
    pmVar10->field_0x77 = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[1].nmon = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].nmon + 1) = iVar1;
    break;
  case '\x02':
    iVar1 = mread8(mf);
    pmVar10->field_0x74 = iVar1;
    break;
  case '\x03':
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10->field_0x74 = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10[1].nmon = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].nmon + 4) = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10[1].data = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].data + 4) = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10[1].dlevel = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].dlevel + 4) = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10[1].minvent = iVar7;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].minvent + 4) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].minvent + 5) = iVar1;
    bVar3 = mread8(mf);
    *(byte *)((long)&pmVar10[1].minvent + 6) =
         *(byte *)((long)&pmVar10[1].minvent + 6) & 0xfe | bVar3 & 1;
    break;
  case '\x04':
    iVar7 = mread32(mf);
    if (iVar7 == -1000) {
      local_50 = (coord *)0xfffffffffffffc18;
    }
    else {
      if (iVar7 == -2000) {
        local_58 = (coord *)0x0;
      }
      else {
        local_58 = pmVar10->mtrack + (long)iVar7 * 8 + 0x18;
      }
      local_50 = local_58;
    }
    *(coord **)&pmVar10[0x1b].mnum = local_50;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].movement = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].movement + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].mintrinsics = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].mintrinsics + 1) = iVar1;
    iVar7 = mread32(mf);
    pmVar10[0x1b].mtame = (char)iVar7;
    pmVar10[0x1b].m_ap_type = (char)((uint)iVar7 >> 8);
    pmVar10[0x1b].mfrozen = (char)((uint)iVar7 >> 0x10);
    pmVar10[0x1b].mblinded = (char)((uint)iVar7 >> 0x18);
    uVar9 = mread32(mf);
    pmVar10[0x1b].mappearance = uVar9;
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10[0x1b].field_0x60 = iVar7;
    iVar7 = mread32(mf);
    pmVar10[0x1b].mfleetim = (char)iVar7;
    pmVar10[0x1b].wormno = (char)((uint)iVar7 >> 8);
    pmVar10[0x1b].weapon_check = (char)((uint)iVar7 >> 0x10);
    pmVar10[0x1b].field_0x67 = (char)((uint)iVar7 >> 0x18);
    iVar4 = mread16(mf);
    *(int16_t *)&pmVar10[0x1b].misc_worn_check = iVar4;
    iVar4 = mread16(mf);
    *(int16_t *)((long)&pmVar10[0x1b].misc_worn_check + 2) = iVar4;
    iVar4 = mread16(mf);
    pmVar10[0x1b].mnamelth = (char)iVar4;
    pmVar10[0x1b].mxtyp = (char)((ushort)iVar4 >> 8);
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].mxlth = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].mxlth + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].meating = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].meating + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].meating + 2) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].meating + 3) = iVar1;
    iVar1 = mread8(mf);
    pmVar10[0x1b].field_0x74 = iVar1;
    mread(mf,&pmVar10[0x1b].field_0x75,0x20);
    mread(mf,(void *)((long)&pmVar10[0x1c].minvent + 5),0x20);
    for (mflags = 0; (int)mflags < 200; mflags = mflags + 1) {
      restore_shkbill(mf,(bill_x *)(pmVar10->mtrack + (long)(int)mflags * 8 + 0x18));
    }
    break;
  case '\x05':
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10->field_0x74 = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)&pmVar10[1].nmon = iVar7;
    iVar7 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].nmon + 4) = iVar7;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[1].data = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 2) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 3) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 4) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 5) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 6) = iVar1;
    bVar3 = mread8(mf);
    *(byte *)((long)&pmVar10[1].data + 7) = *(byte *)((long)&pmVar10[1].data + 7) & 0xfe | bVar3 & 1
    ;
    for (mflags = 0; (int)mflags < 0x65; mflags = mflags + 1) {
      restore_fcorr(mf,(fakecorridor *)((long)pmVar10[1].mtrack + (long)(int)mflags * 3 + -0x34));
    }
  }
  *(uint *)&pmVar10->field_0x60 = *(uint *)&pmVar10->field_0x60 & 0xfffffffe | uVar8 >> 0x1f;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffffffd | (uVar8 >> 0x1e & 1) << 1;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffffffb | (uVar8 >> 0x1d & 1) << 2;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffffff7 | (uVar8 >> 0x1c & 1) << 3;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffffff8f | (uVar8 >> 0x19 & 7) << 4;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffffff7f | (uVar8 >> 0x18 & 1) << 7;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffffeff | (uVar8 >> 0x17 & 1) << 8;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffffdff | (uVar8 >> 0x16 & 1) << 9;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffff3ff | (uVar8 >> 0x14 & 3) << 10;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffffcfff | (uVar8 >> 0x12 & 3) << 0xc;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffffbfff | (uVar8 >> 0x11 & 1) << 0xe;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffff7fff | (uVar8 >> 0x10 & 1) << 0xf;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffeffff | (uVar8 >> 0xf & 1) << 0x10;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffdffff | (uVar8 >> 0xe & 1) << 0x11;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfffbffff | (uVar8 >> 0xd & 1) << 0x12;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfff7ffff | (uVar8 >> 0xc & 1) << 0x13;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffefffff | (uVar8 >> 0xb & 1) << 0x14;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffdfffff | (uVar8 >> 10 & 1) << 0x15;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xffbfffff | (uVar8 >> 9 & 1) << 0x16;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xff7fffff | (uVar8 >> 8 & 1) << 0x17;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfeffffff | (uVar8 >> 7 & 1) << 0x18;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfdffffff | (uVar8 >> 6 & 1) << 0x19;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xfbffffff | (uVar8 >> 5 & 1) << 0x1a;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xf7ffffff | (uVar8 >> 4 & 1) << 0x1b;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xefffffff | (uVar8 >> 3 & 1) << 0x1c;
  *(uint *)&pmVar10->field_0x60 =
       *(uint *)&pmVar10->field_0x60 & 0xdfffffff | (uVar8 >> 2 & 1) << 0x1d;
  return pmVar10;
}

Assistant:

struct monst *restore_mon(struct memfile *mf)
{
    struct monst *mon;
    short namelen, xtyp;
    int idx, i, billid;
    unsigned int mflags;
    struct eshk *shk;
    
    mfmagic_check(mf, MON_MAGIC);
    
    namelen = mread16(mf);
    xtyp = mread16(mf);
    mon = newmonst(xtyp, namelen);
    
    idx = mread32(mf);
    switch (idx) {
	case -1000: mon->data = &pm_leader; break;
	case -2000: mon->data = &pm_guardian; break;
	case -3000: mon->data = &pm_nemesis; break;
	case -4000: mon->data = &upermonst; break;
	case -5000: mon->data = NULL; break;
	default:
	    if (LOW_PM <= idx && idx < NUMMONS)
		mon->data = &mons[idx];
	    else
		panic("Restoring bad monster data.");
	    break;
    }
    
    mon->m_id = mread32(mf);
    mon->mhp = mread32(mf);
    mon->mhpmax = mread32(mf);
    mon->mspec_used = mread32(mf);
    mon->mtrapseen = mread32(mf);
    mon->mlstmv = mread32(mf);
    mon->mstrategy = mread32(mf);
    mon->meating = mread32(mf);
    mread(mf, mon->mtrack, sizeof(mon->mtrack));
    mon->mnum = mread16(mf);
    mon->mx = mread8(mf);
    mon->my = mread8(mf);
    mon->mux = mread8(mf);
    mon->muy = mread8(mf);
    mon->m_lev = mread8(mf);
    mon->malign = mread8(mf);
    mon->movement = mread16(mf);
    mon->mintrinsics = mread16(mf);
    mon->mtame = mread8(mf);
    mon->m_ap_type = mread8(mf);
    mon->mfrozen = mread8(mf);
    mon->mblinded = mread8(mf);
    mon->mappearance = mread32(mf);
    mflags = mread32(mf);
    
    mon->mfleetim = mread8(mf);
    mon->weapon_check = mread8(mf);
    mon->misc_worn_check = mread32(mf);
    mon->wormno = mread8(mf);
    
    /* just mark the pointers for later restoration */
    mon->minvent = mread8(mf) ? (void*)1 : NULL;
    mon->mw = mread8(mf) ? (void*)1 : NULL;
    
    if (mon->mnamelth)
	mread(mf, NAME(mon), mon->mnamelth);
    
    switch (mon->mxtyp) {
	case MX_EPRI:
	    EPRI(mon)->shralign = mread8(mf);
	    EPRI(mon)->shroom = mread8(mf);
	    EPRI(mon)->shrpos.x = mread8(mf);
	    EPRI(mon)->shrpos.y = mread8(mf);
	    EPRI(mon)->shrlevel.dnum = mread8(mf);
	    EPRI(mon)->shrlevel.dlevel = mread8(mf);
	    break;
	    
	case MX_EMIN:
	    EMIN(mon)->min_align = mread8(mf);
	    break;
	    
	case MX_EDOG:
	    EDOG(mon)->droptime = mread32(mf);
	    EDOG(mon)->dropdist = mread32(mf);
	    EDOG(mon)->apport = mread32(mf);
	    EDOG(mon)->whistletime = mread32(mf);
	    EDOG(mon)->hungrytime = mread32(mf);
	    EDOG(mon)->abuse = mread32(mf);
	    EDOG(mon)->revivals = mread32(mf);
	    EDOG(mon)->mhpmax_penalty = mread32(mf);
	    EDOG(mon)->ogoal.x = mread8(mf);
	    EDOG(mon)->ogoal.y = mread8(mf);
	    EDOG(mon)->killed_by_u = mread8(mf);
	    break;
	    
	case MX_ESHK:
	    shk = ESHK(mon);
	    billid = mread32(mf);
	    shk->bill_p = (billid == -1000) ? (struct bill_x*)-1000 :
			  (billid == -2000) ? NULL : &shk->bill[billid];
	    shk->shk.x = mread8(mf);
	    shk->shk.y = mread8(mf);
	    shk->shd.x = mread8(mf);
	    shk->shd.y = mread8(mf);
	    shk->robbed = mread32(mf);
	    shk->credit = mread32(mf);
	    shk->debit = mread32(mf);
	    shk->loan = mread32(mf);
	    shk->shoptype = mread16(mf);
	    shk->billct = mread16(mf);
	    shk->visitct = mread16(mf);
	    shk->shoplevel.dnum = mread8(mf);
	    shk->shoplevel.dlevel = mread8(mf);
	    shk->shoproom = mread8(mf);
	    shk->following = mread8(mf);
	    shk->surcharge = mread8(mf);
	    shk->cheapskate = mread8(mf);
	    shk->pbanned = mread8(mf);
	    mread(mf, shk->customer, sizeof(shk->customer));
	    mread(mf, shk->shknam, sizeof(shk->shknam));
	    for (i = 0; i < BILLSZ; i++)
		restore_shkbill(mf, &shk->bill[i]);
	    break;
	    
	case MX_EGD:
	    EGD(mon)->fcbeg = mread32(mf);
	    EGD(mon)->fcend = mread32(mf);
	    EGD(mon)->vroom = mread32(mf);
	    EGD(mon)->gdx = mread8(mf);
	    EGD(mon)->gdy = mread8(mf);
	    EGD(mon)->ogx = mread8(mf);
	    EGD(mon)->ogy = mread8(mf);
	    EGD(mon)->gdlevel.dnum = mread8(mf);
	    EGD(mon)->gdlevel.dlevel = mread8(mf);
	    EGD(mon)->warncnt = mread8(mf);
	    EGD(mon)->gddone = mread8(mf);
	    for (i = 0; i < FCSIZ; i++)
		restore_fcorr(mf, &EGD(mon)->fakecorr[i]);
	    break;
    }
    
    mon->female		= (mflags >> 31) & 1;
    mon->minvis		= (mflags >> 30) & 1;
    mon->invis_blkd	= (mflags >> 29) & 1;
    mon->perminvis	= (mflags >> 28) & 1;
    mon->cham		= (mflags >> 25) & 7;
    mon->mundetected	= (mflags >> 24) & 1;
    mon->mcan		= (mflags >> 23) & 1;
    mon->mburied	= (mflags >> 22) & 1;
    mon->mspeed		= (mflags >> 20) & 3;
    mon->permspeed	= (mflags >> 18) & 3;
    mon->mrevived	= (mflags >> 17) & 1;
    mon->mavenge	= (mflags >> 16) & 1;
    mon->mflee		= (mflags >> 15) & 1;
    mon->mcansee	= (mflags >> 14) & 1;
    mon->mcanmove	= (mflags >> 13) & 1;
    mon->msleeping	= (mflags >> 12) & 1;
    mon->mstun		= (mflags >> 11) & 1;
    mon->mconf		= (mflags >> 10) & 1;
    mon->mpeaceful	= (mflags >> 9) & 1;
    mon->mtrapped	= (mflags >> 8) & 1;
    mon->mleashed	= (mflags >> 7) & 1;
    mon->isshk		= (mflags >> 6) & 1;
    mon->isminion	= (mflags >> 5) & 1;
    mon->isgd		= (mflags >> 4) & 1;
    mon->ispriest	= (mflags >> 3) & 1;
    mon->iswiz		= (mflags >> 2) & 1;

    return mon;
}